

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask19_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = *in;
  *out = uVar2;
  uVar1 = in[1];
  *out = uVar1 << 0x13 | uVar2;
  uVar1 = uVar1 >> 0xd;
  out[1] = uVar1;
  uVar1 = in[2] << 6 | uVar1;
  out[1] = uVar1;
  uVar2 = in[3];
  out[1] = uVar2 << 0x19 | uVar1;
  uVar2 = uVar2 >> 7;
  out[2] = uVar2;
  uVar2 = in[4] << 0xc | uVar2;
  out[2] = uVar2;
  uVar1 = in[5];
  out[2] = uVar1 << 0x1f | uVar2;
  uVar1 = uVar1 >> 1;
  out[3] = uVar1;
  uVar2 = in[6];
  out[3] = uVar2 << 0x12 | uVar1;
  uVar2 = uVar2 >> 0xe;
  out[4] = uVar2;
  out[4] = in[7] << 5 | uVar2;
  return out + 5;
}

Assistant:

uint32_t *__fastpackwithoutmask19_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (19 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (19 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (19 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (19 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;

  return out + 1;
}